

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O1

void __thiscall cubeb_resampler_drain_Test::TestBody(cubeb_resampler_drain_Test *this)

{
  bool bVar1;
  cubeb_resampler *resampler;
  long lVar2;
  stringstream *this_00;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  int cb_count;
  AssertionResult gtest_ar;
  AssertHelper local_238;
  cubeb_stream_params output_params;
  float out_buffer [128];
  
  output_params.channels = 1;
  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.rate = 0xac44;
  cb_count = 0;
  resampler = cubeb_resampler_create
                        ((cubeb_stream *)0x0,(cubeb_stream_params *)0x0,&output_params,48000,
                         test_drain_data_cb,&cb_count,CUBEB_RESAMPLER_QUALITY_VOIP,
                         CUBEB_RESAMPLER_RECLOCK_NONE);
  do {
    lVar2 = cubeb_resampler_fill(resampler,(void *)0x0,(long *)0x0,out_buffer,0x80);
  } while (lVar2 == 0x80);
  local_258.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"cb_count","1",&cb_count,(int *)&local_258);
  if (gtest_ar.success_ == false) {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    local_258.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x21d,message);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    if (local_258.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_258.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_258.ptr_ + 8))();
      }
      local_258.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cubeb_resampler_destroy(resampler);
  }
  return;
}

Assistant:

TEST(cubeb, resampler_drain)
{
  cubeb_stream_params output_params;
  int target_rate;

  output_params.rate = 44100;
  output_params.channels = 1;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  target_rate = 48000;
  int cb_count = 0;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, nullptr, &output_params, target_rate,
                           test_drain_data_cb, &cb_count,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  const long out_frames = 128;
  float out_buffer[out_frames];
  long got;

  do {
    got = cubeb_resampler_fill(resampler, nullptr, nullptr,
                               out_buffer, out_frames);
  } while (got == out_frames);

  /* The callback should be called once but not again after returning <
   * frame_count. */
  ASSERT_EQ(cb_count, 1);

  cubeb_resampler_destroy(resampler);
}